

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

drmp3_bool32 drmp3__on_seek_memory(void *pUserData,int byteOffset,drmp3_seek_origin origin)

{
  ulong uVar1;
  
  if (origin == drmp3_seek_origin_current) {
    uVar1 = *(ulong *)((long)pUserData + 0x52e8);
    if (byteOffset < 1) {
      if (uVar1 < (uint)-byteOffset) {
        byteOffset = -(int)uVar1;
      }
    }
    else if (*(ulong *)((long)pUserData + 0x52e0) < (uint)byteOffset + uVar1) {
      byteOffset = (int)*(ulong *)((long)pUserData + 0x52e0) - (int)uVar1;
    }
    *(long *)((long)pUserData + 0x52e8) = *(long *)((long)pUserData + 0x52e8) + (long)byteOffset;
  }
  else {
    uVar1 = *(ulong *)((long)pUserData + 0x52e0);
    if ((uint)byteOffset <= uVar1) {
      uVar1 = (ulong)byteOffset;
    }
    *(ulong *)((long)pUserData + 0x52e8) = uVar1;
  }
  return 1;
}

Assistant:

static drmp3_bool32 drmp3__on_seek_memory(void* pUserData, int byteOffset, drmp3_seek_origin origin)
{
    drmp3* pMP3 = (drmp3*)pUserData;
            drmp3_assert(pMP3 != NULL);

    if (origin == drmp3_seek_origin_current) {
        if (byteOffset > 0) {
            if (pMP3->memory.currentReadPos + byteOffset > pMP3->memory.dataSize) {
                byteOffset = (int)(pMP3->memory.dataSize - pMP3->memory.currentReadPos);  // Trying to seek too far forward.
            }
        } else {
            if (pMP3->memory.currentReadPos < (size_t)-byteOffset) {
                byteOffset = -(int)pMP3->memory.currentReadPos;  // Trying to seek too far backwards.
            }
        }

        // This will never underflow thanks to the clamps above.
        pMP3->memory.currentReadPos += byteOffset;
    } else {
        if ((drmp3_uint32)byteOffset <= pMP3->memory.dataSize) {
            pMP3->memory.currentReadPos = byteOffset;
        } else {
            pMP3->memory.currentReadPos = pMP3->memory.dataSize;  // Trying to seek too far forward.
        }
    }

    return DRMP3_TRUE;
}